

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::detail::decomp_assert(detail *this,Enum at,char *file,int line,char *expr,Result *result)

{
  byte bVar1;
  code *pcVar2;
  char extraout_AL;
  bool bVar3;
  undefined4 in_register_0000000c;
  Enum at_00;
  undefined4 in_register_00000034;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  ResultBuilder rb;
  ResultBuilder local_80;
  
  local_80.super_AssertData.m_file = (char *)CONCAT44(in_register_00000034,at);
  local_80.super_AssertData.m_line = (int)file;
  local_80.super_AssertData.m_expr = (char *)CONCAT44(in_register_0000000c,line);
  bVar1 = *expr;
  local_80.super_AssertData.m_failed = (bool)(bVar1 ^ 1);
  at_00 = (Enum)this;
  local_80.super_AssertData.m_at = at_00;
  if (is_running_in_test == '\0') {
    if (bVar1 != 0) {
      return;
    }
    local_80.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_80.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_80.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_80.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_80.super_AssertData.m_test_case = *(TestCaseData **)(g_cs + 0x28);
    local_80.super_AssertData.m_threw = false;
    local_80.super_AssertData.m_threw_as = false;
    local_80.super_AssertData.m_exception_type = "";
    local_80.super_AssertData.m_exception_string = "";
    String::operator=(&local_80.super_AssertData.m_decomp,(String *)(expr + 8));
    if (*(code **)(g_cs + 0x10f0) == (code *)0x0) {
      abort();
    }
    (**(code **)(g_cs + 0x10f0))(&local_80);
    bVar3 = isDebuggerActive();
    if ((bVar3) && (*(char *)(g_cs + 0x7e) == '\0')) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    bVar3 = checkIfShouldThrow(at_00);
    if (bVar3) {
      throwException();
    }
  }
  else {
    local_80.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_80.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_80.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_80.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_80.super_AssertData.m_test_case = *(TestCaseData **)(g_cs + 0x28);
    local_80.super_AssertData.m_threw = false;
    local_80.super_AssertData.m_threw_as = false;
    local_80.super_AssertData.m_exception_type = "";
    local_80.super_AssertData.m_exception_string = "";
    if ((bVar1 == 0) || (*(char *)(g_cs + 0x74) == '\x01')) {
      String::operator=(&local_80.super_AssertData.m_decomp,(String *)(expr + 8));
      in_XMM0_Qa = extraout_XMM0_Qa;
    }
    ResultBuilder::log(&local_80,in_XMM0_Qa);
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    if ((local_80.super_AssertData.m_failed == true) && (bVar3 = checkIfShouldThrow(at_00), bVar3))
    {
      throwException();
    }
  }
  if ((local_80.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_80.super_AssertData.m_decomp.field_0._1_7_,
                       local_80.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_80.super_AssertData.m_decomp.field_0._1_7_,
                                       local_80.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_80.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_80.super_AssertData.m_exception.field_0._1_7_,
                       local_80.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_80.super_AssertData.m_exception.field_0._1_7_,
                                       local_80.super_AssertData.m_exception.field_0.buf[0]));
  }
  return;
}

Assistant:

void decomp_assert(assertType::Enum at, const char* file, int line, const char* expr,
                       Result result) {
        bool failed = !result.m_passed;

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(result.m_decomp);
        DOCTEST_ASSERT_IN_TESTS(result.m_decomp);
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
    }